

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_predicate_data_send(nghttp2_session *session,nghttp2_stream *stream)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  iVar1 = session_predicate_for_stream_send(session,stream);
  if (iVar1 == 0) {
    if (stream == (nghttp2_stream *)0x0) {
      __assert_fail("stream",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0x87e,
                    "int nghttp2_session_predicate_data_send(nghttp2_session *, nghttp2_stream *)");
    }
    if ((stream->stream_id == 0) || (((session->server == '\0' ^ (byte)stream->stream_id) & 1) != 0)
       ) {
      iVar2 = (uint)(stream->state == NGHTTP2_STREAM_CLOSING) * 3 + -0x202;
      iVar1 = 0;
      bVar3 = stream->state == NGHTTP2_STREAM_OPENED;
    }
    else {
      iVar2 = -0x202;
      if (stream->state != NGHTTP2_STREAM_RESERVED) {
        iVar2 = 0;
      }
      bVar3 = stream->state == NGHTTP2_STREAM_CLOSING;
      iVar1 = -0x1ff;
    }
    if (!bVar3) {
      iVar1 = iVar2;
    }
  }
  return iVar1;
}

Assistant:

static int nghttp2_session_predicate_data_send(nghttp2_session *session,
                                               nghttp2_stream *stream) {
  int rv;
  rv = session_predicate_for_stream_send(session, stream);
  if (rv != 0) {
    return rv;
  }
  assert(stream);
  if (nghttp2_session_is_my_stream_id(session, stream->stream_id)) {
    /* Request body data */
    /* If stream->state is NGHTTP2_STREAM_CLOSING, RST_STREAM was
       queued but not yet sent. In this case, we won't send DATA
       frames. */
    if (stream->state == NGHTTP2_STREAM_CLOSING) {
      return NGHTTP2_ERR_STREAM_CLOSING;
    }
    if (stream->state == NGHTTP2_STREAM_RESERVED) {
      return NGHTTP2_ERR_INVALID_STREAM_STATE;
    }
    return 0;
  }
  /* Response body data */
  if (stream->state == NGHTTP2_STREAM_OPENED) {
    return 0;
  }
  if (stream->state == NGHTTP2_STREAM_CLOSING) {
    return NGHTTP2_ERR_STREAM_CLOSING;
  }
  return NGHTTP2_ERR_INVALID_STREAM_STATE;
}